

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::cmMakefileLibraryTargetGenerator
          (cmMakefileLibraryTargetGenerator *this,cmGeneratorTarget *target)

{
  TargetType TVar1;
  cmOSXBundleGenerator *this_00;
  cmGeneratorTarget *target_local;
  cmMakefileLibraryTargetGenerator *this_local;
  
  cmMakefileTargetGenerator::cmMakefileTargetGenerator
            (&this->super_cmMakefileTargetGenerator,target);
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
  _vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmMakefileLibraryTargetGenerator_00be1780;
  std::__cxx11::string::string((string *)&this->FrameworkVersion);
  std::__cxx11::string::string((string *)&this->DeviceLinkObject);
  (this->super_cmMakefileTargetGenerator).CustomCommandDriver = OnDepends;
  TVar1 = cmGeneratorTarget::GetType
                    ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  if (TVar1 != INTERFACE_LIBRARY) {
    cmGeneratorTarget::GetLibraryNames
              ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget
               ,&(this->super_cmMakefileTargetGenerator).TargetNameOut,
               &(this->super_cmMakefileTargetGenerator).TargetNameSO,
               &(this->super_cmMakefileTargetGenerator).TargetNameReal,
               &(this->super_cmMakefileTargetGenerator).TargetNameImport,
               &(this->super_cmMakefileTargetGenerator).TargetNamePDB,
               &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  }
  this_00 = (cmOSXBundleGenerator *)operator_new(0x40);
  cmOSXBundleGenerator::cmOSXBundleGenerator
            (this_00,target,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  (this->super_cmMakefileTargetGenerator).OSXBundleGenerator = this_00;
  cmOSXBundleGenerator::SetMacContentFolders
            ((this->super_cmMakefileTargetGenerator).OSXBundleGenerator,
             &(this->super_cmMakefileTargetGenerator).MacContentFolders);
  return;
}

Assistant:

cmMakefileLibraryTargetGenerator::cmMakefileLibraryTargetGenerator(
  cmGeneratorTarget* target)
  : cmMakefileTargetGenerator(target)
{
  this->CustomCommandDriver = OnDepends;
  if (this->GeneratorTarget->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
    this->GeneratorTarget->GetLibraryNames(
      this->TargetNameOut, this->TargetNameSO, this->TargetNameReal,
      this->TargetNameImport, this->TargetNamePDB, this->ConfigName);
  }

  this->OSXBundleGenerator =
    new cmOSXBundleGenerator(target, this->ConfigName);
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}